

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strutil.cc
# Opt level: O0

bool google::protobuf::safe_strtod(char *str,double *value)

{
  bool bVar1;
  double *in_RSI;
  char *in_RDI;
  double dVar2;
  char *endptr;
  char *in_stack_00000028;
  bool local_19;
  char *local_18;
  
  dVar2 = internal::NoLocaleStrtod(in_stack_00000028,(char **)str);
  *in_RSI = dVar2;
  if (local_18 != in_RDI) {
    while (bVar1 = ascii_isspace(*local_18), bVar1) {
      local_18 = local_18 + 1;
    }
  }
  local_19 = false;
  if (*in_RDI != '\0') {
    local_19 = *local_18 == '\0';
  }
  return local_19;
}

Assistant:

bool safe_strtod(const char* str, double* value) {
  char* endptr;
  *value = internal::NoLocaleStrtod(str, &endptr);
  if (endptr != str) {
    while (ascii_isspace(*endptr)) ++endptr;
  }
  // Ignore range errors from strtod.  The values it
  // returns on underflow and overflow are the right
  // fallback in a robust setting.
  return *str != '\0' && *endptr == '\0';
}